

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.c
# Opt level: O0

float ** directions(PGMData *gy,PGMData *gx)

{
  float **ppfVar1;
  float fVar2;
  int local_30;
  int local_2c;
  int j_1;
  int i_1;
  int j;
  int i;
  float **dir_matrix;
  PGMData *gx_local;
  PGMData *gy_local;
  
  ppfVar1 = mem_alloc(gy->row,gy->col);
  for (i_1 = 0; i_1 < gy->row; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < gy->col; j_1 = j_1 + 1) {
      ppfVar1[i_1][j_1] = 0.0;
    }
  }
  for (local_2c = 0; local_2c < gy->row; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < gy->col; local_30 = local_30 + 1) {
      fVar2 = atanf(gy->pixel_matrix[local_2c][local_30] / gx->pixel_matrix[local_2c][local_30]);
      ppfVar1[local_2c][local_30] = fVar2;
    }
  }
  return ppfVar1;
}

Assistant:

float **directions(PGMData *gy, PGMData *gx)
{
    float **dir_matrix = mem_alloc(gy->row, gy->col);
    for (int i = 0; i < gy->row; ++i)
    {
        for (int j = 0; j < gy->col; ++j)
        {
            dir_matrix[i][j] = 0;
        }
    }

    for (int i = 0; i < gy->row; ++i)
    {
        for (int j = 0; j < gy->col; ++j)
        {
            dir_matrix[i][j] = atanf(gy->pixel_matrix[i][j] / gx->pixel_matrix[i][j]);
        }
    }

    return dir_matrix;
}